

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Emb_ManPrintStats(Emb_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Emb_Man_t *p_local;
  
  uVar1 = Emb_ManPiNum(p);
  uVar2 = Emb_ManPoNum(p);
  printf("i/o =%7d/%7d  ",(ulong)uVar1,(ulong)uVar2);
  iVar3 = Emb_ManRegNum(p);
  if (iVar3 != 0) {
    uVar1 = Emb_ManRegNum(p);
    printf("ff =%7d  ",(ulong)uVar1);
  }
  uVar1 = Emb_ManNodeNum(p);
  printf("node =%8d  ",(ulong)uVar1);
  uVar1 = Emb_ManObjNum(p);
  printf("obj =%8d  ",(ulong)uVar1);
  printf("mem =%5.2f MB",((double)p->nObjData * 4.0) / 1048576.0);
  printf("\n");
  return;
}

Assistant:

void Emb_ManPrintStats( Emb_Man_t * p )
{
//    if ( p->pName )
//        printf( "%8s : ", p->pName );
    printf( "i/o =%7d/%7d  ", Emb_ManPiNum(p), Emb_ManPoNum(p) );
    if ( Emb_ManRegNum(p) )
        printf( "ff =%7d  ", Emb_ManRegNum(p) );
    printf( "node =%8d  ", Emb_ManNodeNum(p) );
    printf( "obj =%8d  ", Emb_ManObjNum(p) );
//    printf( "lev =%5d  ", Emb_ManLevelNum(p) );
//    printf( "cut =%5d  ", Emb_ManCrossCut(p) );
    printf( "mem =%5.2f MB", 4.0*p->nObjData/(1<<20) );
//    printf( "obj =%5d  ", Emb_ManObjNum(p) );
    printf( "\n" );

//    Emb_ManSatExperiment( p );
}